

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase378::run(TestCase378 *this)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *pTVar2;
  long lVar3;
  int counter;
  Own<kj::_::PromiseNode> local_128;
  Own<kj::_::PromiseNode> local_118;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_f8;
  Own<kj::_::PromiseNode> local_e8;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_c8;
  Own<kj::_::PromiseNode> local_b8;
  Own<kj::_::PromiseNode> local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  counter = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.disposer = (Disposer *)0x0;
  local_a8.ptr = (PromiseNode *)0x0;
  local_b8.disposer = (Disposer *)0x0;
  local_b8.ptr = (PromiseNode *)0x0;
  _::yield();
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_f8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:385:27),_kj::_::PropagateException>
             ::anon_class_16_2_209cabb3_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041ad68;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&counter;
  pTVar2[1].dependency.disposer = (Disposer *)&local_b8;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase378::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_c8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase378::run()::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)0x0;
  local_128.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase378::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (PromiseNode *)0x0;
  local_128.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose(&local_c8);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_f8);
  Promise<void>::eagerlyEvaluate((Promise<void> *)&local_118,&local_128);
  Own<kj::_::PromiseNode>::operator=(&local_a8,&local_118);
  Own<kj::_::PromiseNode>::dispose(&local_118);
  Own<kj::_::PromiseNode>::dispose(&local_128);
  _::yield();
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_118,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:420:27),_kj::_::PropagateException>
             ::anon_class_8_1_bc7188dc_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b098;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&counter;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::TestCase378::run()::$_1,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)pTVar2;
  _::maybeChain<void>(&local_f8,(Promise<void> *)&intermediate);
  pPVar1 = local_f8.ptr;
  local_c8.disposer = local_f8.disposer;
  local_f8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_f8);
  local_e8.disposer = local_f8.disposer;
  local_e8.ptr = pPVar1;
  local_c8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_c8);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_118);
  Promise<void>::eagerlyEvaluate((Promise<void> *)&local_128,&local_e8);
  Own<kj::_::PromiseNode>::operator=(&local_b8,&local_128);
  Own<kj::_::PromiseNode>::dispose(&local_128);
  Own<kj::_::PromiseNode>::dispose(&local_e8);
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x10) {
    Promise<void>::wait((Promise<void> *)((long)&local_b8.disposer + lVar3),&waitScope);
  }
  if ((counter != 7) && (_::Debug::minSeverity < 3)) {
    intermediate.disposer = (Disposer *)CONCAT44(intermediate.disposer._4_4_,7);
    _::Debug::log<char_const(&)[34],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1b0,ERROR,"\"failed: expected \" \"(7) == (counter)\", 7, counter",
               (char (*) [34])"failed: expected (7) == (counter)",(int *)&intermediate,&counter);
  }
  lVar3 = 0x40;
  do {
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)((long)&local_a8.disposer + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -0x20);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Ordering) {
  EventLoop loop;
  WaitScope waitScope(loop);

  int counter = 0;
  Promise<void> promises[6] = {nullptr, nullptr, nullptr, nullptr, nullptr, nullptr};

  promises[1] = evalLater([&]() {
    EXPECT_EQ(0, counter++);

    {
      // Use a promise and fulfiller so that we can fulfill the promise after waiting on it in
      // order to induce depth-first scheduling.
      auto paf = kj::newPromiseAndFulfiller<void>();
      promises[2] = paf.promise.then([&]() {
        EXPECT_EQ(1, counter++);
      }).eagerlyEvaluate(nullptr);
      paf.fulfiller->fulfill();
    }

    // .then() is scheduled breadth-first if the promise has already resolved, but depth-first
    // if the promise resolves later.
    promises[3] = Promise<void>(READY_NOW).then([&]() {
      EXPECT_EQ(4, counter++);
    }).then([&]() {
      EXPECT_EQ(5, counter++);
    }).eagerlyEvaluate(nullptr);

    {
      auto paf = kj::newPromiseAndFulfiller<void>();
      promises[4] = paf.promise.then([&]() {
        EXPECT_EQ(2, counter++);
      }).eagerlyEvaluate(nullptr);
      paf.fulfiller->fulfill();
    }

    // evalLater() is like READY_NOW.then().
    promises[5] = evalLater([&]() {
      EXPECT_EQ(6, counter++);
    }).eagerlyEvaluate(nullptr);
  }).eagerlyEvaluate(nullptr);

  promises[0] = evalLater([&]() {
    EXPECT_EQ(3, counter++);

    // Making this a chain should NOT cause it to preempt promises[1].  (This was a problem at one
    // point.)
    return Promise<void>(READY_NOW);
  }).eagerlyEvaluate(nullptr);

  for (auto i: indices(promises)) {
    kj::mv(promises[i]).wait(waitScope);
  }

  EXPECT_EQ(7, counter);
}